

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void __thiscall
duckdb::ModeFunction<duckdb::ModeStandard<signed_char>_>::
UpdateWindowState<duckdb::ModeState<signed_char,_duckdb::ModeStandard<signed_char>_>,_signed_char>::
Right(UpdateWindowState<duckdb::ModeState<signed_char,_duckdb::ModeStandard<signed_char>_>,_signed_char>
      *this,idx_t begin,idx_t end)

{
  bool bVar1;
  idx_t local_20;
  
  while (begin < end) {
    local_20 = begin;
    bVar1 = ModeIncluded<duckdb::ModeState<signed_char,_duckdb::ModeStandard<signed_char>_>_>::
            operator()(this->included,&local_20);
    if (bVar1) {
      ModeState<signed_char,_duckdb::ModeStandard<signed_char>_>::ModeAdd(this->state,local_20);
    }
    begin = local_20 + 1;
  }
  return;
}

Assistant:

inline void Right(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					state.ModeAdd(begin);
				}
			}
		}